

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RewindLoopFixedCont::Exec
          (RewindLoopFixedCont *this,Matcher *matcher,Char *input,CharCount *inputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Program *pPVar6;
  LoopInfo *pLVar7;
  long lVar8;
  ulong uVar9;
  
  Matcher::QueryContinue(matcher,qcTicks);
  uVar9 = (ulong)*(uint *)&(this->super_Cont).field_0xc;
  pPVar6 = (matcher->program).ptr;
  if ((ulong)(pPVar6->rep).insts.instsLen < uVar9 + 0x17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar3) goto LAB_00ef1d00;
    *puVar5 = 0;
    pPVar6 = (matcher->program).ptr;
  }
  lVar8 = *(long *)&pPVar6->rep;
  if (*(char *)(lVar8 + uVar9) != 'J') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar3) goto LAB_00ef1d00;
    *puVar5 = 0;
    pPVar6 = (matcher->program).ptr;
    lVar8 = *(long *)&pPVar6->rep;
  }
  iVar1 = *(int *)(lVar8 + 1 + uVar9);
  if (((long)iVar1 < 0) || (pPVar6->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar3) goto LAB_00ef1d00;
    *puVar5 = 0;
  }
  pLVar7 = (matcher->loopInfos).ptr + iVar1;
  if (this->tryingBody == true) {
    this->tryingBody = false;
    uVar4 = pLVar7->number;
    if (uVar4 < *(uint *)(lVar8 + 5 + uVar9)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x1245,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar3) goto LAB_00ef1d00;
      *puVar5 = 0;
      uVar4 = pLVar7->number;
    }
  }
  else {
    uVar4 = pLVar7->number;
    if (uVar4 <= *(uint *)(lVar8 + 5 + uVar9)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x124a,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar3) goto LAB_00ef1d00;
      *puVar5 = 0;
      uVar4 = pLVar7->number;
    }
    uVar4 = uVar4 - 1;
    pLVar7->number = uVar4;
  }
  *inputOffset = uVar4 * *(int *)(lVar8 + 0x13 + uVar9) + pLVar7->startInputOffset;
  if (*(uint *)(lVar8 + 5 + uVar9) < pLVar7->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  uVar4 = *(uint *)(lVar8 + 0xf + uVar9);
  pPVar6 = (matcher->program).ptr;
  if ((pPVar6->rep).insts.instsLen <= uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar3) {
LAB_00ef1d00:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pPVar6 = (matcher->program).ptr;
  }
  *instPointer = (pPVar6->rep).insts.insts.ptr + uVar4;
  return true;
}

Assistant:

inline bool RewindLoopFixedCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before trying body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }